

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsTTDGetSnapTimeTopLevelEventMove
          (JsRuntimeHandle runtimeHandle,JsTTDMoveMode moveMode,uint32_t kthEvent,
          int64_t *targetEventTime,int64_t *targetStartSnapTime,int64_t *targetEndSnapTime)

{
  ThreadContext *pTVar1;
  EventLog *this;
  JsrtRuntime *pJVar2;
  int64 iVar3;
  
  pJVar2 = JsrtRuntime::FromHandle(runtimeHandle);
  pTVar1 = pJVar2->threadContext;
  *targetStartSnapTime = -1;
  if (targetEndSnapTime != (int64_t *)0x0) {
    *targetEndSnapTime = -1;
  }
  this = pTVar1->TTDLog;
  if (this == (EventLog *)0x0) {
    TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
  }
  if ((moveMode & JsTTDMoveFirstEvent) == JsTTDMoveNone) {
    if ((moveMode & JsTTDMoveLastEvent) == JsTTDMoveNone) {
      if ((moveMode & JsTTDMoveKthEvent) == JsTTDMoveNone) {
        iVar3 = *targetEventTime;
        goto LAB_00377233;
      }
      iVar3 = TTD::EventLog::GetKthEventTimeInLog(this,kthEvent);
    }
    else {
      iVar3 = TTD::EventLog::GetLastEventTimeInLog(this);
    }
  }
  else {
    iVar3 = TTD::EventLog::GetFirstEventTimeInLog(this);
  }
  *targetEventTime = iVar3;
  if (iVar3 == -1) {
    return JsErrorCategoryUsage;
  }
LAB_00377233:
  iVar3 = TTD::EventLog::FindSnapTimeForEventTime(pTVar1->TTDLog,iVar3,targetEndSnapTime);
  *targetStartSnapTime = iVar3;
  return JsNoError;
}

Assistant:

CHAKRA_API JsTTDGetSnapTimeTopLevelEventMove(_In_ JsRuntimeHandle runtimeHandle,
   _In_ JsTTDMoveMode moveMode, _In_opt_ uint32_t kthEvent,
   _Inout_ int64_t* targetEventTime, _Out_ int64_t* targetStartSnapTime,
   _Out_opt_ int64_t* targetEndSnapTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtRuntime* runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext* threadContext = runtime->GetThreadContext();

    *targetStartSnapTime = -1;
    if(targetEndSnapTime != nullptr)
    {
        *targetEndSnapTime = -1;
    }

    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

    //If we requested a move to a specific event then extract the event count and try to find it
    if((moveMode & JsTTDMoveMode::JsTTDMoveFirstEvent) == JsTTDMoveMode::JsTTDMoveFirstEvent)
    {
        *targetEventTime = threadContext->TTDLog->GetFirstEventTimeInLog();
        if(*targetEventTime == -1)
        {
            return JsErrorCategoryUsage;
        }
    }
    else if((moveMode & JsTTDMoveMode::JsTTDMoveLastEvent) == JsTTDMoveMode::JsTTDMoveLastEvent)
    {
        *targetEventTime = threadContext->TTDLog->GetLastEventTimeInLog();
        if(*targetEventTime == -1)
        {
            return JsErrorCategoryUsage;
        }
    }
    else if((moveMode & JsTTDMoveMode::JsTTDMoveKthEvent) == JsTTDMoveMode::JsTTDMoveKthEvent)
    {
        *targetEventTime = threadContext->TTDLog->GetKthEventTimeInLog(kthEvent);
        if(*targetEventTime == -1)
        {
            return JsErrorCategoryUsage;
        }
    }
    else
    {
        ;
    }

#ifdef __APPLE__
    //TODO: Explicit cast of ptr since compiler gets confused -- resolve in PAL later
    static_assert(sizeof(int64_t) == sizeof(int64), "int64_t and int64 size mis-match");
    *targetStartSnapTime = threadContext->TTDLog->FindSnapTimeForEventTime(*targetEventTime, (int64*)targetEndSnapTime);
#else
    *targetStartSnapTime = threadContext->TTDLog->FindSnapTimeForEventTime(*targetEventTime, targetEndSnapTime);
#endif

    return JsNoError;
#endif
}